

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadraticLikeCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::QuadraticLikeCost::costFirstPartialDerivativeWRTState
          (QuadraticLikeCost *this,double time,VectorDynSize *state,VectorDynSize *param_4,
          VectorDynSize *partialDerivative)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  double *scalar;
  double *pdVar4;
  element_type *peVar5;
  undefined4 extraout_var_00;
  ostream *poVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  ulong in_RCX;
  long in_RDI;
  double in_XMM0_Qa;
  ostringstream errorMsg_4;
  ostringstream errorMsg_3;
  VectorDynSize *gradient;
  ostringstream errorMsg_2;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  MatrixDynSize *hessian;
  bool isValid;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff518;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff520;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff528;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff530;
  ostringstream *this_00;
  MatrixBase<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff538;
  StorageBaseType *in_stack_fffffffffffff550;
  string local_a28 [32];
  ostringstream local_a08 [376];
  string local_890 [32];
  ostringstream local_870 [376];
  undefined8 local_6f8;
  undefined8 local_618;
  string local_518 [32];
  ostringstream local_4f8 [376];
  string local_380 [32];
  ostringstream local_360 [376];
  string local_1e8 [48];
  ostringstream local_1b8 [376];
  undefined8 local_40;
  byte local_31 [25];
  double local_18;
  byte local_1;
  
  local_18 = in_XMM0_Qa;
  iDynTree::VectorDynSize::size();
  iDynTree::VectorDynSize::resize(in_RCX);
  iDynTree::VectorDynSize::zero();
  local_31[0] = 0;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x28));
  if (bVar1) {
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::MatrixDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33e52d);
    iVar2 = (*peVar3->_vptr_TimeVaryingObject[2])(local_18,peVar3,local_31);
    local_40 = CONCAT44(extraout_var,iVar2);
    if ((local_31[0] & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      poVar6 = std::operator<<((ostream *)local_1b8,
                               "Unable to retrieve a valid state hessian at time: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
      std::operator<<(poVar6,".");
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costFirstPartialDerivativeWRTState",pcVar7);
      std::__cxx11::string::~string(local_1e8);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_1b8);
      goto LAB_0033ec93;
    }
    lVar8 = iDynTree::MatrixDynSize::rows();
    lVar9 = iDynTree::MatrixDynSize::cols();
    if (lVar8 != lVar9) {
      std::__cxx11::ostringstream::ostringstream(local_360);
      poVar6 = std::operator<<((ostream *)local_360,"The state hessian at time: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
      std::operator<<(poVar6," is not squared.");
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costFirstPartialDerivativeWRTState",pcVar7);
      std::__cxx11::string::~string(local_380);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_360);
      goto LAB_0033ec93;
    }
    scalar = (double *)iDynTree::MatrixDynSize::rows();
    pdVar4 = (double *)iDynTree::VectorDynSize::size();
    if (scalar != pdVar4) {
      std::__cxx11::ostringstream::ostringstream(local_4f8);
      poVar6 = std::operator<<((ostream *)local_4f8,"The hessian at time: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
      std::operator<<(poVar6," does not match the state dimension.");
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costFirstPartialDerivativeWRTState",pcVar7);
      std::__cxx11::string::~string(local_518);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_4f8);
      goto LAB_0033ec93;
    }
    local_618 = 0x3fe0000000000000;
    toEigen((MatrixDynSize *)in_stack_fffffffffffff538);
    toEigen((MatrixDynSize *)in_stack_fffffffffffff538);
    Eigen::
    DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::transpose(in_stack_fffffffffffff518);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>>::
    operator+(in_stack_fffffffffffff538,
              (MatrixBase<Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
               *)in_stack_fffffffffffff530);
    Eigen::operator*(scalar,in_stack_fffffffffffff550);
    toEigen((VectorDynSize *)in_stack_fffffffffffff528);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,-1,1,-1,-1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>const,Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>const,0,Eigen::Stride<0,0>>>const>const>>
    ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>_>
                 *)in_stack_fffffffffffff528,in_stack_fffffffffffff520);
    toEigen((VectorDynSize *)in_stack_fffffffffffff528);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
    operator+=(in_stack_fffffffffffff530,
               (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Transpose<Eigen::Map<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>_>,_Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                *)in_stack_fffffffffffff528);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x38));
  if (bVar1) {
    local_31[0] = 0;
    peVar5 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimeVaryingObject<iDynTree::VectorDynSize>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x33e9eb);
    iVar2 = (*peVar5->_vptr_TimeVaryingObject[2])(local_18,peVar5,local_31);
    local_6f8 = CONCAT44(extraout_var_00,iVar2);
    if ((local_31[0] & 1) == 0) {
      this_00 = local_870;
      std::__cxx11::ostringstream::ostringstream(this_00);
      poVar6 = std::operator<<((ostream *)this_00,
                               "Unable to retrieve a valid state gradient at time: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
      std::operator<<(poVar6,".");
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costFirstPartialDerivativeWRTState",pcVar7);
      std::__cxx11::string::~string(local_890);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_870);
      goto LAB_0033ec93;
    }
    lVar8 = iDynTree::VectorDynSize::size();
    lVar9 = iDynTree::VectorDynSize::size();
    if (lVar8 != lVar9) {
      std::__cxx11::ostringstream::ostringstream(local_a08);
      poVar6 = std::operator<<((ostream *)local_a08,"The state and the gradient at time: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18);
      std::operator<<(poVar6," have different dimensions.");
      std::__cxx11::ostringstream::str();
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("QuadraticLikeCost","costFirstPartialDerivativeWRTState",pcVar7);
      std::__cxx11::string::~string(local_a28);
      local_1 = 0;
      std::__cxx11::ostringstream::~ostringstream(local_a08);
      goto LAB_0033ec93;
    }
    toEigen((VectorDynSize *)in_stack_fffffffffffff528);
    toEigen((VectorDynSize *)in_stack_fffffffffffff528);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>>::
    operator+=(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
  }
  local_1 = 1;
LAB_0033ec93:
  return (bool)(local_1 & 1);
}

Assistant:

bool QuadraticLikeCost::costFirstPartialDerivativeWRTState(double time,
                                                               const iDynTree::VectorDynSize& state,
                                                               const iDynTree::VectorDynSize& /*control*/,
                                                               iDynTree::VectorDynSize& partialDerivative)
        {
            partialDerivative.resize(state.size());
            partialDerivative.zero();

            bool isValid = false;

            if (m_timeVaryingStateHessian) {

                const MatrixDynSize &hessian = m_timeVaryingStateHessian->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state hessian at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != hessian.cols()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state hessian at time: " << time << " is not squared.";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (hessian.rows() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The hessian at time: " << time << " does not match the state dimension.";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }
                toEigen(partialDerivative) += 0.5 * (toEigen(hessian) + toEigen(hessian).transpose()) * toEigen(state);
            }

            if (m_timeVaryingStateGradient) {

                isValid = false;
                const VectorDynSize &gradient = m_timeVaryingStateGradient->get(time, isValid);

                if (!isValid) {
                    std::ostringstream errorMsg;
                    errorMsg << "Unable to retrieve a valid state gradient at time: " << time << ".";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (state.size() != gradient.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state and the gradient at time: " << time << " have different dimensions.";
                    reportError("QuadraticLikeCost", "costFirstPartialDerivativeWRTState", errorMsg.str().c_str());
                    return false;
                }

                toEigen(partialDerivative) += toEigen(gradient);
            }

            return true;
        }